

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall fixedPreciseMeasurement_cast_Test::TestBody(fixedPreciseMeasurement_cast_Test *this)

{
  units local_48 [8];
  fixed_measurement m4;
  fixed_measurement m3;
  fixed_precise_measurement m1;
  fixedPreciseMeasurement_cast_Test *this_local;
  
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)&m3.units_,2.0,(precise_unit *)units::precise::m);
  units::measurement_cast((units *)&m4.units_,(fixed_precise_measurement *)&m3.units_);
  units::measurement_cast(local_48,(fixed_measurement *)&m4.units_);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, cast)
{
    fixed_precise_measurement m1(2.0, precise::m);
    auto m3 = measurement_cast(m1);

    auto m4 = measurement_cast(m3);
    static_assert(
        std::is_same<decltype(m3), fixed_measurement>::value,
        "measurement cast not working for fixed_precise_measurement");
    static_assert(
        std::is_same<decltype(m4), fixed_measurement>::value,
        "measurement cast not working for fixed_measurement");
}